

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::GetPrimElementName_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,tinyusdz *this,Value *v)

{
  Model *pMVar1;
  Scope *pSVar2;
  Xform *pXVar3;
  GPrim *pGVar4;
  GeomMesh *pGVar5;
  GeomPoints *pGVar6;
  GeomCube *pGVar7;
  GeomCapsule *pGVar8;
  GeomCylinder *pGVar9;
  GeomSphere *pGVar10;
  GeomCone *pGVar11;
  GeomSubset *pGVar12;
  GeomCamera *pGVar13;
  GeomBasisCurves *pGVar14;
  DomeLight *pDVar15;
  SphereLight *pSVar16;
  CylinderLight *pCVar17;
  DiskLight *pDVar18;
  RectLight *pRVar19;
  Material *pMVar20;
  Shader *pSVar21;
  UsdPreviewSurface *pUVar22;
  UsdUVTexture *pUVar23;
  UsdPrimvarReader<int> *pUVar24;
  UsdPrimvarReader<float> *pUVar25;
  UsdPrimvarReader<std::array<float,_2UL>_> *pUVar26;
  UsdPrimvarReader<std::array<float,_3UL>_> *pUVar27;
  UsdPrimvarReader<std::array<float,_4UL>_> *pUVar28;
  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pUVar29;
  UsdPrimvarReader<tinyusdz::value::normal3f> *pUVar30;
  UsdPrimvarReader<tinyusdz::value::vector3f> *pUVar31;
  UsdPrimvarReader<tinyusdz::value::point3f> *pUVar32;
  UsdPrimvarReader<tinyusdz::value::matrix4d> *pUVar33;
  SkelRoot *pSVar34;
  Skeleton *pSVar35;
  SkelAnimation *pSVar36;
  BlendShape *pBVar37;
  Value *v_local;
  
  pMVar1 = value::Value::as<tinyusdz::Model>((Value *)this,false);
  if (pMVar1 == (Model *)0x0) {
    pSVar2 = value::Value::as<tinyusdz::Scope>((Value *)this,false);
    if (pSVar2 == (Scope *)0x0) {
      pXVar3 = value::Value::as<tinyusdz::Xform>((Value *)this,false);
      if (pXVar3 == (Xform *)0x0) {
        pGVar4 = value::Value::as<tinyusdz::GPrim>((Value *)this,false);
        if (pGVar4 == (GPrim *)0x0) {
          pGVar5 = value::Value::as<tinyusdz::GeomMesh>((Value *)this,false);
          if (pGVar5 == (GeomMesh *)0x0) {
            pGVar6 = value::Value::as<tinyusdz::GeomPoints>((Value *)this,false);
            if (pGVar6 == (GeomPoints *)0x0) {
              pGVar7 = value::Value::as<tinyusdz::GeomCube>((Value *)this,false);
              if (pGVar7 == (GeomCube *)0x0) {
                pGVar8 = value::Value::as<tinyusdz::GeomCapsule>((Value *)this,false);
                if (pGVar8 == (GeomCapsule *)0x0) {
                  pGVar9 = value::Value::as<tinyusdz::GeomCylinder>((Value *)this,false);
                  if (pGVar9 == (GeomCylinder *)0x0) {
                    pGVar10 = value::Value::as<tinyusdz::GeomSphere>((Value *)this,false);
                    if (pGVar10 == (GeomSphere *)0x0) {
                      pGVar11 = value::Value::as<tinyusdz::GeomCone>((Value *)this,false);
                      if (pGVar11 == (GeomCone *)0x0) {
                        pGVar12 = value::Value::as<tinyusdz::GeomSubset>((Value *)this,false);
                        if (pGVar12 == (GeomSubset *)0x0) {
                          pGVar13 = value::Value::as<tinyusdz::GeomCamera>((Value *)this,false);
                          if (pGVar13 == (GeomCamera *)0x0) {
                            pGVar14 = value::Value::as<tinyusdz::GeomBasisCurves>
                                                ((Value *)this,false);
                            if (pGVar14 == (GeomBasisCurves *)0x0) {
                              pDVar15 = value::Value::as<tinyusdz::DomeLight>((Value *)this,false);
                              if (pDVar15 == (DomeLight *)0x0) {
                                pSVar16 = value::Value::as<tinyusdz::SphereLight>
                                                    ((Value *)this,false);
                                if (pSVar16 == (SphereLight *)0x0) {
                                  pCVar17 = value::Value::as<tinyusdz::CylinderLight>
                                                      ((Value *)this,false);
                                  if (pCVar17 == (CylinderLight *)0x0) {
                                    pDVar18 = value::Value::as<tinyusdz::DiskLight>
                                                        ((Value *)this,false);
                                    if (pDVar18 == (DiskLight *)0x0) {
                                      pRVar19 = value::Value::as<tinyusdz::RectLight>
                                                          ((Value *)this,false);
                                      if (pRVar19 == (RectLight *)0x0) {
                                        pMVar20 = value::Value::as<tinyusdz::Material>
                                                            ((Value *)this,false);
                                        if (pMVar20 == (Material *)0x0) {
                                          pSVar21 = value::Value::as<tinyusdz::Shader>
                                                              ((Value *)this,false);
                                          if (pSVar21 == (Shader *)0x0) {
                                            pUVar22 = value::Value::as<tinyusdz::UsdPreviewSurface>
                                                                ((Value *)this,false);
                                            if (pUVar22 == (UsdPreviewSurface *)0x0) {
                                              pUVar23 = value::Value::as<tinyusdz::UsdUVTexture>
                                                                  ((Value *)this,false);
                                              if (pUVar23 == (UsdUVTexture *)0x0) {
                                                pUVar24 = value::Value::
                                                          as<tinyusdz::UsdPrimvarReader<int>>
                                                                    ((Value *)this,false);
                                                if (pUVar24 == (UsdPrimvarReader<int> *)0x0) {
                                                  pUVar25 = value::Value::
                                                            as<tinyusdz::UsdPrimvarReader<float>>
                                                                      ((Value *)this,false);
                                                  if (pUVar25 == (UsdPrimvarReader<float> *)0x0) {
                                                    pUVar26 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                                                            ((Value *)this,false);
                                                  if (pUVar26 ==
                                                      (UsdPrimvarReader<std::array<float,_2UL>_> *)
                                                      0x0) {
                                                    pUVar27 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                                                            ((Value *)this,false);
                                                  if (pUVar27 ==
                                                      (UsdPrimvarReader<std::array<float,_3UL>_> *)
                                                      0x0) {
                                                    pUVar28 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                                                            ((Value *)this,false);
                                                  if (pUVar28 ==
                                                      (UsdPrimvarReader<std::array<float,_4UL>_> *)
                                                      0x0) {
                                                    pUVar29 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                                                            ((Value *)this,false);
                                                  if (pUVar29 ==
                                                      (
                                                  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)0x0) {
                                                    pUVar30 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                                                            ((Value *)this,false);
                                                  if (pUVar30 ==
                                                      (UsdPrimvarReader<tinyusdz::value::normal3f> *
                                                      )0x0) {
                                                    pUVar31 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                                                            ((Value *)this,false);
                                                  if (pUVar31 ==
                                                      (UsdPrimvarReader<tinyusdz::value::vector3f> *
                                                      )0x0) {
                                                    pUVar32 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                                                            ((Value *)this,false);
                                                  if (pUVar32 ==
                                                      (UsdPrimvarReader<tinyusdz::value::point3f> *)
                                                      0x0) {
                                                    pUVar33 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
                                                            ((Value *)this,false);
                                                  if (pUVar33 ==
                                                      (UsdPrimvarReader<tinyusdz::value::matrix4d> *
                                                      )0x0) {
                                                    pSVar34 = value::Value::as<tinyusdz::SkelRoot>
                                                                        ((Value *)this,false);
                                                    if (pSVar34 == (SkelRoot *)0x0) {
                                                      pSVar35 = value::Value::as<tinyusdz::Skeleton>
                                                                          ((Value *)this,false);
                                                      if (pSVar35 == (Skeleton *)0x0) {
                                                        pSVar36 = value::Value::
                                                                  as<tinyusdz::SkelAnimation>
                                                                            ((Value *)this,false);
                                                        if (pSVar36 == (SkelAnimation *)0x0) {
                                                          pBVar37 = value::Value::
                                                                    as<tinyusdz::BlendShape>
                                                                              ((Value *)this,false);
                                                          if (pBVar37 == (BlendShape *)0x0) {
                                                            nonstd::optional_lite::
                                                                                                                        
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::optional(__return_storage_ptr__);
                                                  }
                                                  else {
                                                    pBVar37 = value::Value::as<tinyusdz::BlendShape>
                                                                        ((Value *)this,false);
                                                    nonstd::optional_lite::
                                                                                                        
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,&pBVar37->name);
                                                  }
                                                  }
                                                  else {
                                                    pSVar36 = value::Value::
                                                              as<tinyusdz::SkelAnimation>
                                                                        ((Value *)this,false);
                                                    nonstd::optional_lite::
                                                                                                        
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,&pSVar36->name);
                                                  }
                                                  }
                                                  else {
                                                    pSVar35 = value::Value::as<tinyusdz::Skeleton>
                                                                        ((Value *)this,false);
                                                    nonstd::optional_lite::
                                                                                                        
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,&pSVar35->name);
                                                  }
                                                  }
                                                  else {
                                                    pSVar34 = value::Value::as<tinyusdz::SkelRoot>
                                                                        ((Value *)this,false);
                                                    nonstd::optional_lite::
                                                                                                        
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,&pSVar34->name);
                                                  }
                                                  }
                                                  else {
                                                    pUVar33 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
                                                            ((Value *)this,false);
                                                  nonstd::optional_lite::
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar33);
                                                  }
                                                  }
                                                  else {
                                                    pUVar32 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                                                            ((Value *)this,false);
                                                  nonstd::optional_lite::
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar32);
                                                  }
                                                  }
                                                  else {
                                                    pUVar31 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                                                            ((Value *)this,false);
                                                  nonstd::optional_lite::
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar31);
                                                  }
                                                  }
                                                  else {
                                                    pUVar30 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                                                            ((Value *)this,false);
                                                  nonstd::optional_lite::
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar30);
                                                  }
                                                  }
                                                  else {
                                                    pUVar29 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                                                            ((Value *)this,false);
                                                  nonstd::optional_lite::
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar29);
                                                  }
                                                  }
                                                  else {
                                                    pUVar28 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                                                            ((Value *)this,false);
                                                  nonstd::optional_lite::
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar28);
                                                  }
                                                  }
                                                  else {
                                                    pUVar27 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                                                            ((Value *)this,false);
                                                  nonstd::optional_lite::
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar27);
                                                  }
                                                  }
                                                  else {
                                                    pUVar26 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                                                            ((Value *)this,false);
                                                  nonstd::optional_lite::
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar26);
                                                  }
                                                  }
                                                  else {
                                                    pUVar25 = value::Value::
                                                              as<tinyusdz::UsdPrimvarReader<float>>
                                                                        ((Value *)this,false);
                                                    nonstd::optional_lite::
                                                                                                        
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar25);
                                                  }
                                                }
                                                else {
                                                  pUVar24 = value::Value::
                                                            as<tinyusdz::UsdPrimvarReader<int>>
                                                                      ((Value *)this,false);
                                                  nonstd::optional_lite::
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                            (__return_storage_ptr__,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar24);
                                                }
                                              }
                                              else {
                                                pUVar23 = value::Value::as<tinyusdz::UsdUVTexture>
                                                                    ((Value *)this,false);
                                                nonstd::optional_lite::
                                                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::
                                                optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                          (__return_storage_ptr__,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar23);
                                              }
                                            }
                                            else {
                                              pUVar22 = value::Value::
                                                        as<tinyusdz::UsdPreviewSurface>
                                                                  ((Value *)this,false);
                                              nonstd::optional_lite::
                                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::
                                              optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                        (__return_storage_ptr__,
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pUVar22);
                                            }
                                          }
                                          else {
                                            pSVar21 = value::Value::as<tinyusdz::Shader>
                                                                ((Value *)this,false);
                                            nonstd::optional_lite::
                                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::
                                            optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                      (__return_storage_ptr__,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pSVar21);
                                          }
                                        }
                                        else {
                                          pMVar20 = value::Value::as<tinyusdz::Material>
                                                              ((Value *)this,false);
                                          nonstd::optional_lite::
                                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::
                                          optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                    (__return_storage_ptr__,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pMVar20);
                                        }
                                      }
                                      else {
                                        pRVar19 = value::Value::as<tinyusdz::RectLight>
                                                            ((Value *)this,false);
                                        nonstd::optional_lite::
                                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::
                                        optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                  (__return_storage_ptr__,
                                                   &(pRVar19->super_BoundableLight).name);
                                      }
                                    }
                                    else {
                                      pDVar18 = value::Value::as<tinyusdz::DiskLight>
                                                          ((Value *)this,false);
                                      nonstd::optional_lite::
                                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::
                                      optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                                (__return_storage_ptr__,
                                                 &(pDVar18->super_BoundableLight).name);
                                    }
                                  }
                                  else {
                                    pCVar17 = value::Value::as<tinyusdz::CylinderLight>
                                                        ((Value *)this,false);
                                    nonstd::optional_lite::
                                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::
                                    optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                              (__return_storage_ptr__,
                                               &(pCVar17->super_BoundableLight).name);
                                  }
                                }
                                else {
                                  pSVar16 = value::Value::as<tinyusdz::SphereLight>
                                                      ((Value *)this,false);
                                  nonstd::optional_lite::
                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::
                                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                            (__return_storage_ptr__,
                                             &(pSVar16->super_BoundableLight).name);
                                }
                              }
                              else {
                                pDVar15 = value::Value::as<tinyusdz::DomeLight>((Value *)this,false)
                                ;
                                nonstd::optional_lite::
                                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::
                                optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                          (__return_storage_ptr__,
                                           &(pDVar15->super_NonboundableLight).name);
                              }
                            }
                            else {
                              pGVar14 = value::Value::as<tinyusdz::GeomBasisCurves>
                                                  ((Value *)this,false);
                              nonstd::optional_lite::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::
                              optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                        (__return_storage_ptr__,&(pGVar14->super_GPrim).name);
                            }
                          }
                          else {
                            pGVar13 = value::Value::as<tinyusdz::GeomCamera>((Value *)this,false);
                            nonstd::optional_lite::
                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::
                            optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                      (__return_storage_ptr__,&(pGVar13->super_GPrim).name);
                          }
                        }
                        else {
                          pGVar12 = value::Value::as<tinyusdz::GeomSubset>((Value *)this,false);
                          nonstd::optional_lite::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                    (__return_storage_ptr__,&pGVar12->name);
                        }
                      }
                      else {
                        pGVar11 = value::Value::as<tinyusdz::GeomCone>((Value *)this,false);
                        nonstd::optional_lite::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::
                        optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                  (__return_storage_ptr__,&(pGVar11->super_GPrim).name);
                      }
                    }
                    else {
                      pGVar10 = value::Value::as<tinyusdz::GeomSphere>((Value *)this,false);
                      nonstd::optional_lite::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::
                      optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                (__return_storage_ptr__,&(pGVar10->super_GPrim).name);
                    }
                  }
                  else {
                    pGVar9 = value::Value::as<tinyusdz::GeomCylinder>((Value *)this,false);
                    nonstd::optional_lite::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::
                    optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                              (__return_storage_ptr__,&(pGVar9->super_GPrim).name);
                  }
                }
                else {
                  pGVar8 = value::Value::as<tinyusdz::GeomCapsule>((Value *)this,false);
                  nonstd::optional_lite::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                            (__return_storage_ptr__,&(pGVar8->super_GPrim).name);
                }
              }
              else {
                pGVar7 = value::Value::as<tinyusdz::GeomCube>((Value *)this,false);
                nonstd::optional_lite::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                          (__return_storage_ptr__,&(pGVar7->super_GPrim).name);
              }
            }
            else {
              pGVar6 = value::Value::as<tinyusdz::GeomPoints>((Value *)this,false);
              nonstd::optional_lite::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                        (__return_storage_ptr__,&(pGVar6->super_GPrim).name);
            }
          }
          else {
            pGVar5 = value::Value::as<tinyusdz::GeomMesh>((Value *)this,false);
            nonstd::optional_lite::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                      (__return_storage_ptr__,&(pGVar5->super_GPrim).name);
          }
        }
        else {
          pGVar4 = value::Value::as<tinyusdz::GPrim>((Value *)this,false);
          nonstd::optional_lite::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    (__return_storage_ptr__,&pGVar4->name);
        }
      }
      else {
        pXVar3 = value::Value::as<tinyusdz::Xform>((Value *)this,false);
        nonstd::optional_lite::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                  (__return_storage_ptr__,&(pXVar3->super_GPrim).name);
      }
    }
    else {
      pSVar2 = value::Value::as<tinyusdz::Scope>((Value *)this,false);
      nonstd::optional_lite::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                (__return_storage_ptr__,&pSVar2->name);
    }
  }
  else {
    pMVar1 = value::Value::as<tinyusdz::Model>((Value *)this,false);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
              (__return_storage_ptr__,&pMVar1->name);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::string> GetPrimElementName(const value::Value &v) {
  // Since multiple get_value() call consumes lots of stack size(depends on
  // sizeof(T)?), Following code would produce 100KB of stack in debug build. So
  // use as() instead(as() => roughly 2000 bytes for stack size).
#if 0
  //
  // TODO: Find a better C++ way... use a std::function?
  //
  if (auto pv = v.get_value<Model>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<Scope>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<Xform>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<GPrim>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<GeomMesh>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<GeomBasisCurves>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<GeomSphere>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<GeomCube>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<GeomCylinder>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<GeomCapsule>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<GeomCone>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<GeomSubset>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<GeomCamera>()) {
    return Path(pv.value().name, "");
  }

  if (auto pv = v.get_value<DomeLight>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<SphereLight>()) {
    return Path(pv.value().name, "");
  }
  // if (auto pv = v.get_value<CylinderLight>()) { return
  // Path(pv.value().name); } if (auto pv = v.get_value<DiskLight>()) {
  // return Path(pv.value().name); }

  if (auto pv = v.get_value<Material>()) {
    return Path(pv.value().name, "");
  }
  if (auto pv = v.get_value<Shader>()) {
    return Path(pv.value().name, "");
  }
  // if (auto pv = v.get_value<UVTexture>()) { return Path(pv.value().name); }
  // if (auto pv = v.get_value<PrimvarReader()) { return Path(pv.value().name);
  // }

  return nonstd::nullopt;
#else

  // Lookup name field of Prim class

#define EXTRACT_NAME_AND_RETURN_PATH(__ty) \
  if (v.as<__ty>()) {                      \
    return v.as<__ty>()->name;             \
  } else

  EXTRACT_NAME_AND_RETURN_PATH(Model)
  EXTRACT_NAME_AND_RETURN_PATH(Scope)
  EXTRACT_NAME_AND_RETURN_PATH(Xform)
  EXTRACT_NAME_AND_RETURN_PATH(GPrim)
  EXTRACT_NAME_AND_RETURN_PATH(GeomMesh)
  EXTRACT_NAME_AND_RETURN_PATH(GeomPoints)
  EXTRACT_NAME_AND_RETURN_PATH(GeomCube)
  EXTRACT_NAME_AND_RETURN_PATH(GeomCapsule)
  EXTRACT_NAME_AND_RETURN_PATH(GeomCylinder)
  EXTRACT_NAME_AND_RETURN_PATH(GeomSphere)
  EXTRACT_NAME_AND_RETURN_PATH(GeomCone)
  EXTRACT_NAME_AND_RETURN_PATH(GeomSubset)
  EXTRACT_NAME_AND_RETURN_PATH(GeomCamera)
  EXTRACT_NAME_AND_RETURN_PATH(GeomBasisCurves)
  EXTRACT_NAME_AND_RETURN_PATH(DomeLight)
  EXTRACT_NAME_AND_RETURN_PATH(SphereLight)
  EXTRACT_NAME_AND_RETURN_PATH(CylinderLight)
  EXTRACT_NAME_AND_RETURN_PATH(DiskLight)
  EXTRACT_NAME_AND_RETURN_PATH(RectLight)
  EXTRACT_NAME_AND_RETURN_PATH(Material)
  EXTRACT_NAME_AND_RETURN_PATH(Shader)
  // TODO: extract name must be handled in Shader class
  EXTRACT_NAME_AND_RETURN_PATH(UsdPreviewSurface)
  EXTRACT_NAME_AND_RETURN_PATH(UsdUVTexture)
  EXTRACT_NAME_AND_RETURN_PATH(UsdPrimvarReader_int)
  EXTRACT_NAME_AND_RETURN_PATH(UsdPrimvarReader_float)
  EXTRACT_NAME_AND_RETURN_PATH(UsdPrimvarReader_float2)
  EXTRACT_NAME_AND_RETURN_PATH(UsdPrimvarReader_float3)
  EXTRACT_NAME_AND_RETURN_PATH(UsdPrimvarReader_float4)
  EXTRACT_NAME_AND_RETURN_PATH(UsdPrimvarReader_string)
  EXTRACT_NAME_AND_RETURN_PATH(UsdPrimvarReader_normal)
  EXTRACT_NAME_AND_RETURN_PATH(UsdPrimvarReader_vector)
  EXTRACT_NAME_AND_RETURN_PATH(UsdPrimvarReader_point)
  EXTRACT_NAME_AND_RETURN_PATH(UsdPrimvarReader_matrix)
  //
  EXTRACT_NAME_AND_RETURN_PATH(SkelRoot)
  EXTRACT_NAME_AND_RETURN_PATH(Skeleton)
  EXTRACT_NAME_AND_RETURN_PATH(SkelAnimation)
  EXTRACT_NAME_AND_RETURN_PATH(BlendShape) { return nonstd::nullopt; }

#undef EXTRACT_NAME_AND_RETURN_PATH

#endif
}